

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

Vec_Ptr_t * Saig_ManBmcDfsNodes(Aig_Man_t *p,Vec_Ptr_t *vRoots)

{
  Vec_Ptr_t *vNodes;
  void *pvVar1;
  int i;
  
  vNodes = Vec_PtrAlloc(100);
  for (i = 0; i < vRoots->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vRoots,i);
    Saig_ManBmcDfs_rec(p,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcDfsNodes( Aig_Man_t * p, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Saig_ManBmcDfs_rec( p, Aig_ObjFanin0(pObj), vNodes );
    return vNodes;
}